

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddTable.c
# Opt level: O1

void cuddRehash(DdManager *unique,int i)

{
  uint *puVar1;
  int *piVar2;
  DdNode *pDVar3;
  ulong uVar4;
  ulong uVar5;
  DdManager *pDVar6;
  DdSubtable *pDVar7;
  DdNode **ppDVar8;
  DdNode **ppDVar9;
  DdManager *pDVar10;
  DdNode **ppDVar11;
  DdNode **ppDVar12;
  DdNode *pDVar13;
  _func_void_long *p_Var14;
  int iVar15;
  DdNode **ppDVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  uint uVar20;
  DdNode **ppDVar21;
  uint uVar22;
  DdNode **__ptr;
  
  if (((unique->gcFrac == 4.0) && (!NAN(unique->gcFrac))) && (unique->looseUpTo < unique->slots)) {
    unique->gcFrac = 1.0;
    unique->minDead = unique->slots;
  }
  if (((unique->gcFrac != 0.2) || (NAN(unique->gcFrac))) && (unique->maxmem < unique->memused)) {
    unique->gcFrac = 0.2;
    unique->minDead = (uint)(long)((double)unique->slots * 0.2);
    cuddShrinkDeathRow(unique);
    iVar15 = cuddGarbageCollect(unique,1);
    if (0 < iVar15) {
      return;
    }
  }
  p_Var14 = Extra_UtilMMoutOfMemory;
  if (i == 0x7fffffff) {
    uVar18 = (unique->constants).slots;
    iVar15 = (unique->constants).shift;
    __ptr = (unique->constants).nodelist;
    uVar22 = uVar18 * 2;
    Extra_UtilMMoutOfMemory = Cudd_OutOfMem;
    ppDVar16 = (DdNode **)malloc((ulong)uVar22 * 8);
    if (ppDVar16 == (DdNode **)0x0) {
      Extra_UtilMMoutOfMemory = p_Var14;
      fwrite("Unable to resize constant subtable for lack of memory\n",0x36,1,(FILE *)unique->err);
      cuddGarbageCollect(unique,1);
      iVar15 = unique->size;
      if (0 < (long)iVar15) {
        pDVar7 = unique->subtables;
        lVar19 = 0;
        do {
          piVar2 = (int *)((long)&pDVar7->maxKeys + lVar19);
          *piVar2 = *piVar2 << 1;
          lVar19 = lVar19 + 0x38;
        } while ((long)iVar15 * 0x38 - lVar19 != 0);
      }
      puVar1 = &(unique->constants).maxKeys;
      *puVar1 = *puVar1 << 1;
      return;
    }
    iVar15 = iVar15 + -1;
    Extra_UtilMMoutOfMemory = p_Var14;
    (unique->constants).slots = uVar22;
    (unique->constants).shift = iVar15;
    (unique->constants).maxKeys = uVar18 * 8;
    (unique->constants).nodelist = ppDVar16;
    if (uVar22 != 0) {
      memset(ppDVar16,0,(ulong)uVar22 << 3);
    }
    if (uVar18 != 0) {
      uVar17 = 0;
      do {
        pDVar13 = __ptr[uVar17];
        while (pDVar13 != (DdNode *)0x0) {
          uVar20 = (uint)(((int)((ulong)*(undefined8 *)&pDVar13->type >> 0x20) +
                          (int)*(undefined8 *)&pDVar13->type * 0xc00005) * 0x40f1f9) >>
                   ((byte)iVar15 & 0x1f);
          pDVar3 = pDVar13->next;
          pDVar13->next = ppDVar16[(int)uVar20];
          ppDVar16[(int)uVar20] = pDVar13;
          pDVar13 = pDVar3;
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 != uVar18);
    }
  }
  else {
    pDVar7 = unique->subtables;
    uVar18 = pDVar7[i].slots;
    iVar15 = pDVar7[i].shift;
    __ptr = pDVar7[i].nodelist;
    uVar22 = uVar18 * 2;
    Extra_UtilMMoutOfMemory = Cudd_OutOfMem;
    ppDVar16 = (DdNode **)malloc((ulong)uVar22 * 8);
    if (ppDVar16 == (DdNode **)0x0) {
      Extra_UtilMMoutOfMemory = p_Var14;
      fprintf((FILE *)unique->err,"Unable to resize subtable %d for lack of memory\n",(ulong)(uint)i
             );
      cuddGarbageCollect(unique,1);
      if (unique->stash == (char *)0x0) {
        return;
      }
      free(unique->stash);
      unique->stash = (char *)0x0;
      cuddSlowTableGrowth(unique);
      return;
    }
    iVar15 = iVar15 + -1;
    Extra_UtilMMoutOfMemory = p_Var14;
    pDVar7[i].nodelist = ppDVar16;
    pDVar7[i].slots = uVar22;
    pDVar7[i].shift = iVar15;
    pDVar7[i].maxKeys = uVar18 * 8;
    if (uVar18 != 0) {
      uVar17 = 0;
      do {
        pDVar10 = (DdManager *)__ptr[uVar17];
        ppDVar11 = (DdNode **)(((long)(uVar17 << 0x21) >> 0x1d) + (long)ppDVar16);
        ppDVar12 = ppDVar16 + ((int)uVar17 * 2 + 1);
        while (pDVar10 != unique) {
          ppDVar9 = &(pDVar10->sentinel).next;
          uVar4 = *(ulong *)&(pDVar10->sentinel).type;
          uVar5 = *(ulong *)((long)&(pDVar10->sentinel).type + 8);
          ppDVar21 = ppDVar12;
          ppDVar8 = ppDVar11;
          if (((((uint)uVar5 & 1) + *(int *)((uVar5 & 0xfffffffffffffffe) + 0x20) * 2 +
               (((uint)uVar4 & 1) + *(int *)((uVar4 & 0xfffffffffffffffe) + 0x20) * 2) * 0xc00005) *
               0x40f1f9 & 1 << ((byte)iVar15 & 0x1f)) != 0) {
            ppDVar21 = ppDVar9;
            ppDVar8 = ppDVar12;
            ppDVar9 = ppDVar11;
          }
          pDVar6 = (DdManager *)(pDVar10->sentinel).next;
          *ppDVar8 = &pDVar10->sentinel;
          pDVar10 = pDVar6;
          ppDVar11 = ppDVar9;
          ppDVar12 = ppDVar21;
        }
        *ppDVar12 = &unique->sentinel;
        *ppDVar11 = &unique->sentinel;
        uVar17 = uVar17 + 1;
      } while (uVar17 != uVar18);
    }
  }
  if (__ptr != (DdNode **)0x0) {
    free(__ptr);
  }
  unique->memused = unique->memused + (ulong)(uVar22 - uVar18) * 8;
  uVar22 = (uVar22 - uVar18) + unique->slots;
  unique->slots = uVar22;
  unique->minDead = (uint)(long)((double)uVar22 * unique->gcFrac);
  uVar18 = unique->maxCacheHard;
  if (uVar22 * 4 < unique->maxCacheHard) {
    uVar18 = uVar22 * 4;
  }
  iVar15 = uVar18 + unique->cacheSlots * -2;
  unique->cacheSlack = iVar15;
  if (iVar15 < 0 || uVar22 >> 1 <= unique->cacheSlots) {
    return;
  }
  cuddCacheResize(unique);
  return;
}

Assistant:

void
cuddRehash(
  DdManager * unique,
  int i)
{
    unsigned int slots, oldslots;
    int shift, oldshift;
    int j, pos;
    DdNodePtr *nodelist, *oldnodelist;
    DdNode *node, *next;
    DdNode *sentinel = &(unique->sentinel);
    hack split;
    extern DD_OOMFP MMoutOfMemory;
    DD_OOMFP saveHandler;

    if (unique->gcFrac == DD_GC_FRAC_HI && unique->slots > unique->looseUpTo) {
        unique->gcFrac = DD_GC_FRAC_LO;
        unique->minDead = (unsigned) (DD_GC_FRAC_LO * (double) unique->slots);
#ifdef DD_VERBOSE
        (void) fprintf(unique->err,"GC fraction = %.2f\t", DD_GC_FRAC_LO);
        (void) fprintf(unique->err,"minDead = %d\n", unique->minDead);
#endif
    }

    if (unique->gcFrac != DD_GC_FRAC_MIN && unique->memused > unique->maxmem) {
        unique->gcFrac = DD_GC_FRAC_MIN;
        unique->minDead = (unsigned) (DD_GC_FRAC_MIN * (double) unique->slots);
#ifdef DD_VERBOSE
        (void) fprintf(unique->err,"GC fraction = %.2f\t", DD_GC_FRAC_MIN);
        (void) fprintf(unique->err,"minDead = %d\n", unique->minDead);
#endif
        cuddShrinkDeathRow(unique);
        if (cuddGarbageCollect(unique,1) > 0) return;
    }

    if (i != CUDD_CONST_INDEX) {
        oldslots = unique->subtables[i].slots;
        oldshift = unique->subtables[i].shift;
        oldnodelist = unique->subtables[i].nodelist;

        /* Compute the new size of the subtable. */
        slots = oldslots << 1;
        shift = oldshift - 1;

        saveHandler = MMoutOfMemory;
        MMoutOfMemory = Cudd_OutOfMem;
        nodelist = ABC_ALLOC(DdNodePtr, slots);
        MMoutOfMemory = saveHandler;
        if (nodelist == NULL) {
            (void) fprintf(unique->err,
                           "Unable to resize subtable %d for lack of memory\n",
                           i);
            /* Prevent frequent resizing attempts. */
            (void) cuddGarbageCollect(unique,1);
            if (unique->stash != NULL) {
                ABC_FREE(unique->stash);
                unique->stash = NULL;
                /* Inhibit resizing of tables. */
                cuddSlowTableGrowth(unique);
            }
            return;
        }
        unique->subtables[i].nodelist = nodelist;
        unique->subtables[i].slots = slots;
        unique->subtables[i].shift = shift;
        unique->subtables[i].maxKeys = slots * DD_MAX_SUBTABLE_DENSITY;

        /* Move the nodes from the old table to the new table.
        ** This code depends on the type of hash function.
        ** It assumes that the effect of doubling the size of the table
        ** is to retain one more bit of the 32-bit hash value.
        ** The additional bit is the LSB. */
        for (j = 0; (unsigned) j < oldslots; j++) {
            DdNodePtr *evenP, *oddP;
            node = oldnodelist[j];
            evenP = &(nodelist[j<<1]);
            oddP = &(nodelist[(j<<1)+1]);
            while (node != sentinel) {
                next = node->next;
                pos = ddHash(cuddF2L(cuddT(node)), cuddF2L(cuddE(node)), shift);
                if (pos & 1) {
                    *oddP = node;
                    oddP = &(node->next);
                } else {
                    *evenP = node;
                    evenP = &(node->next);
                }
                node = next;
            }
            *evenP = *oddP = sentinel;
        }
        ABC_FREE(oldnodelist);

#ifdef DD_VERBOSE
        (void) fprintf(unique->err,
                       "rehashing layer %d: keys %d dead %d new size %d\n",
                       i, unique->subtables[i].keys,
                       unique->subtables[i].dead, slots);
#endif
    } else {
        oldslots = unique->constants.slots;
        oldshift = unique->constants.shift;
        oldnodelist = unique->constants.nodelist;

        /* The constant subtable is never subjected to reordering.
        ** Therefore, when it is resized, it is because it has just
        ** reached the maximum load. We can safely just double the size,
        ** with no need for the loop we use for the other tables.
        */
        slots = oldslots << 1;
        shift = oldshift - 1;
        saveHandler = MMoutOfMemory;
        MMoutOfMemory = Cudd_OutOfMem;
        nodelist = ABC_ALLOC(DdNodePtr, slots);
        MMoutOfMemory = saveHandler;
        if (nodelist == NULL) {
            (void) fprintf(unique->err,
                           "Unable to resize constant subtable for lack of memory\n");
            (void) cuddGarbageCollect(unique,1);
            for (j = 0; j < unique->size; j++) {
                unique->subtables[j].maxKeys <<= 1;
            }
            unique->constants.maxKeys <<= 1;
            return;
        }
        unique->constants.slots = slots;
        unique->constants.shift = shift;
        unique->constants.maxKeys = slots * DD_MAX_SUBTABLE_DENSITY;
        unique->constants.nodelist = nodelist;
        for (j = 0; (unsigned) j < slots; j++) {
            nodelist[j] = NULL;
        }
        for (j = 0; (unsigned) j < oldslots; j++) {
            node = oldnodelist[j];
            while (node != NULL) {
                next = node->next;
                split.value = cuddV(node);
                pos = ddHash(split.bits[0], split.bits[1], shift);
                node->next = nodelist[pos];
                nodelist[pos] = node;
                node = next;
            }
        }
        ABC_FREE(oldnodelist);

#ifdef DD_VERBOSE
        (void) fprintf(unique->err,
                       "rehashing constants: keys %d dead %d new size %d\n",
                       unique->constants.keys,unique->constants.dead,slots);
#endif
    }

    /* Update global data */

    unique->memused += (slots - oldslots) * sizeof(DdNodePtr);
    unique->slots += (slots - oldslots);
    ddFixLimits(unique);

}